

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

Alignment MdAlignment(MD_ALIGN a,Alignment defaultAlignment)

{
  long lVar1;
  QFlagsStorage<Qt::AlignmentFlag> in_ESI;
  int in_EDI;
  long in_FS_OFFSET;
  enum_type in_stack_ffffffffffffffe0;
  enum_type in_stack_ffffffffffffffe4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI == 1) {
    local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         Qt::operator|(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  }
  else if (in_EDI == 2) {
    local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         Qt::operator|(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  }
  else {
    local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)(QFlagsStorage<Qt::AlignmentFlag>)in_ESI.i;
    if (in_EDI == 3) {
      local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           Qt::operator|(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)local_c.super_QFlagsStorage<Qt::AlignmentFlag>.i
  ;
}

Assistant:

static Qt::Alignment MdAlignment(MD_ALIGN a, Qt::Alignment defaultAlignment = Qt::AlignLeft | Qt::AlignVCenter)
{
    switch (a) {
    case MD_ALIGN_LEFT:
        return Qt::AlignLeft | Qt::AlignVCenter;
    case MD_ALIGN_CENTER:
        return Qt::AlignHCenter | Qt::AlignVCenter;
    case MD_ALIGN_RIGHT:
        return Qt::AlignRight | Qt::AlignVCenter;
    default: // including MD_ALIGN_DEFAULT
        return defaultAlignment;
    }
}